

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Abc_NtkFinCountPairs(Vec_Wec_t *vClasses)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vLevel;
  int Counter;
  int i;
  Vec_Wec_t *vClasses_local;
  
  vLevel._0_4_ = 0;
  for (vLevel._4_4_ = 0; iVar1 = Vec_WecSize(vClasses), vLevel._4_4_ < iVar1;
      vLevel._4_4_ = vLevel._4_4_ + 1) {
    p = Vec_WecEntry(vClasses,vLevel._4_4_);
    iVar1 = Vec_IntSize(p);
    vLevel._0_4_ = iVar1 + -1 + (int)vLevel;
  }
  return (int)vLevel;
}

Assistant:

int Abc_NtkFinCountPairs( Vec_Wec_t * vClasses )
{
    int i, Counter = 0;
    Vec_Int_t * vLevel;
    Vec_WecForEachLevel( vClasses, vLevel, i )
        Counter += Vec_IntSize(vLevel) - 1;
    return Counter;
}